

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O0

void slang::TimeTrace::beginTrace
               (string_view name,
               function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               detail)

{
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail_00;
  bool bVar1;
  pointer this;
  allocator<char> local_49;
  string local_48;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_intptr_t *p_Stack_28;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail_local;
  string_view name_local;
  
  detail_local.callable = name._M_len;
  detail_local.callback =
       (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_intptr_t *)
       detail.callable;
  p_Stack_28 = detail.callback;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&profiler);
  if (bVar1) {
    this = std::
           unique_ptr<slang::TimeTrace::Profiler,_std::default_delete<slang::TimeTrace::Profiler>_>
           ::operator->((unique_ptr<slang::TimeTrace::Profiler,_std::default_delete<slang::TimeTrace::Profiler>_>
                         *)&profiler);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_48,
               (basic_string_view<char,_std::char_traits<char>_> *)&detail_local.callable,&local_49)
    ;
    detail_00.callable = (intptr_t)detail_local.callback;
    detail_00.callback = p_Stack_28;
    Profiler::begin(this,&local_48,detail_00);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void TimeTrace::beginTrace(string_view name, function_ref<std::string()> detail) {
    if (profiler)
        profiler->begin(std::string(name), detail);
}